

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O3

netaddr * os_interface_generic_get_bindaddress(int af_type,netaddr_acl *filter,os_interface *os_if)

{
  uint8_t uVar1;
  netaddr *pnVar2;
  uint8_t uVar3;
  _Bool _Var4;
  netaddr *pnVar5;
  list_entity *plVar6;
  avl_tree *paVar7;
  list_entity *plVar8;
  list_entity *plVar9;
  
  if ((os_if != (os_interface *)0x0) && ((os_if->flags).any != true)) {
    pnVar5 = _get_exact_match_bindaddress(af_type,filter,os_if);
    if (pnVar5 != (netaddr *)0x0) {
      return pnVar5;
    }
    goto LAB_00125d45;
  }
  if ((filter->reject_count == 0) && (0xfffffffffffffffd < filter->accept_count - 3)) {
    pnVar5 = filter->accept;
    uVar1 = pnVar5->_prefix_len;
    uVar3 = netaddr_get_af_maxprefix((uint)pnVar5->_type);
    if (uVar1 == uVar3) {
      if (filter->accept_count == 2) {
        pnVar2 = filter->accept;
        if ((pnVar5->_type == pnVar2[1]._type) ||
           (uVar1 = pnVar2[1]._prefix_len, uVar3 = netaddr_get_af_maxprefix((uint)pnVar2[1]._type),
           uVar1 != uVar3)) goto LAB_00125d26;
        if ((uint)pnVar2[1]._type == af_type) {
          return pnVar2 + 1;
        }
      }
      if ((uint)pnVar5->_type == af_type) {
        return pnVar5;
      }
    }
  }
LAB_00125d26:
  pnVar5 = _get_exact_match_bindaddress(af_type,filter,os_if);
  if (pnVar5 != (netaddr *)0x0) {
    return pnVar5;
  }
  if (os_if == (os_interface *)0x0) {
    paVar7 = os_interface_linux_get_tree();
    plVar9 = (paVar7->list_head).next;
    plVar6 = plVar9->prev;
    paVar7 = os_interface_linux_get_tree();
    if (plVar6 == (paVar7->list_head).prev) {
      return (netaddr *)0x0;
    }
    do {
      plVar8 = plVar9[-6].next;
      for (plVar6 = plVar9[-7].prev; plVar6->prev != plVar8; plVar6 = plVar6->next) {
        if ((uint)*(byte *)((long)&plVar6[5].prev + 2) == af_type) {
          pnVar5 = (netaddr *)((long)&plVar6[4].prev + 2);
          _Var4 = netaddr_acl_check_accept(filter,pnVar5);
          if (_Var4) {
            return pnVar5;
          }
          plVar8 = plVar9[-6].next;
        }
      }
      plVar9 = plVar9->next;
      plVar6 = plVar9->prev;
      paVar7 = os_interface_linux_get_tree();
    } while (plVar6 != (paVar7->list_head).prev);
    return (netaddr *)0x0;
  }
LAB_00125d45:
  plVar9 = (os_if->addresses).list_head.next;
  plVar6 = (os_if->addresses).list_head.prev;
  do {
    if (plVar9->prev == plVar6) {
      return (netaddr *)0x0;
    }
    if ((uint)*(byte *)((long)&plVar9[5].prev + 2) == af_type) {
      pnVar5 = (netaddr *)((long)&plVar9[4].prev + 2);
      _Var4 = netaddr_acl_check_accept(filter,pnVar5);
      if (_Var4) {
        return pnVar5;
      }
      plVar6 = (os_if->addresses).list_head.prev;
    }
    plVar9 = plVar9->next;
  } while( true );
}

Assistant:

const struct netaddr *
os_interface_generic_get_bindaddress(int af_type, struct netaddr_acl *filter, struct os_interface *os_if) {
  const struct netaddr *result;

  result = NULL;
  if (os_if == NULL || os_if->flags.any) {
    result = _get_fixed_prefix(af_type, filter);
  }
  if (!result) {
    result = _get_exact_match_bindaddress(af_type, filter, os_if);
  }
  if (!result) {
    result = _get_matching_bindaddress(af_type, filter, os_if);
  }
  return result;
}